

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errors.cpp
# Opt level: O2

void __thiscall
program_options::error_with_option_name::substitute_placeholders
          (error_with_option_name *this,string *error_template)

{
  mapped_type *pmVar1;
  size_type sVar2;
  _Base_ptr p_Var3;
  allocator<char> local_a1;
  key_type local_a0;
  string local_80;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  substitutions;
  
  std::__cxx11::string::_M_assign((string *)&this->m_message);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Rb_tree(&substitutions._M_t,&(this->m_substitutions)._M_t);
  get_canonical_option_name_abi_cxx11_(&local_80,this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,"canonical_option",&local_a1);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&substitutions,&local_a0);
  std::__cxx11::string::operator=((string *)pmVar1,(string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_80);
  get_canonical_option_prefix_abi_cxx11_(&local_80,this);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"prefix",&local_a1);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&substitutions,&local_a0);
  std::__cxx11::string::operator=((string *)pmVar1,(string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_80);
  p_Var3 = (this->m_substitution_defaults)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    if ((_Rb_tree_header *)p_Var3 ==
        &(this->m_substitution_defaults)._M_t._M_impl.super__Rb_tree_header) {
      for (p_Var3 = substitutions._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var3 != &substitutions._M_t._M_impl.super__Rb_tree_header;
          p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
        std::operator+(&local_a0,'%',
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (p_Var3 + 1));
        std::operator+(&local_80,&local_a0,'%');
        replace_token(this,&local_80,(string *)(p_Var3 + 2));
        std::__cxx11::string::~string((string *)&local_80);
        std::__cxx11::string::~string((string *)&local_a0);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&substitutions._M_t);
      return;
    }
    sVar2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::count(&substitutions,(key_type *)(p_Var3 + 1));
    if (sVar2 == 0) {
LAB_00113e9f:
      replace_token(this,(string *)(p_Var3 + 2),(string *)(p_Var3 + 3));
    }
    else {
      pmVar1 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&substitutions,(key_type *)(p_Var3 + 1));
      if (pmVar1->_M_string_length == 0) goto LAB_00113e9f;
    }
    p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
  } while( true );
}

Assistant:

void error_with_option_name::substitute_placeholders(const std::string& error_template) const
{
    m_message = error_template;
    std::map<std::string, std::string> substitutions(m_substitutions);
    substitutions["canonical_option"]   = get_canonical_option_name();
    substitutions["prefix"]             = get_canonical_option_prefix();


    //
    //  replace placeholder with defaults if values are missing
    //
    for (std::map<std::string, string_pair>::const_iterator iter = m_substitution_defaults.begin();
          iter != m_substitution_defaults.end(); ++iter)
    {
        // missing parameter: use default
        if (substitutions.count(iter->first) == 0 ||
            substitutions[iter->first].length() == 0)
            replace_token(iter->second.first, iter->second.second);
    }


    //
    //  replace placeholder with values
    //  placeholder are denoted by surrounding '%'
    //
    for (std::map<std::string, std::string>::iterator iter = substitutions.begin();
          iter != substitutions.end(); ++iter)
        replace_token('%' + iter->first + '%', iter->second);
}